

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.h
# Opt level: O0

void __thiscall
fmcalc::fmcalc(fmcalc *this,int maxRunLevel,int allocrule,string *inputpath,bool netvalue,bool debug
              ,bool allocruleOptimizationOff,bool generalOptimization,bool stepped)

{
  bool stepped_local;
  bool generalOptimization_local;
  bool allocruleOptimizationOff_local;
  bool debug_local;
  bool netvalue_local;
  string *inputpath_local;
  int allocrule_local;
  int maxRunLevel_local;
  fmcalc *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)inputpath);
  this->netvalue_ = netvalue;
  this->allocrule_ = allocrule;
  this->debug_ = debug;
  this->allocruleOptimizationOff_ = allocruleOptimizationOff;
  this->generalOptimization_ = generalOptimization;
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector(&this->policy_tc_vec_vec_vec_);
  std::vector<int,_std::allocator<int>_>::vector(&this->level_to_maxagg_id_);
  this->max_layer_ = 0;
  this->max_agg_id_ = 0;
  this->isGULStreamType_ = true;
  this->isOldGULStreamType_ = false;
  std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>::vector(&this->profile_vec_new_);
  std::
  vector<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
  ::vector(&this->profile_vec_stepped_);
  this->maxLevel_ = -1;
  this->maxRunLevel_ = 10000;
  this->max_level_ = 0;
  std::vector<int,_std::allocator<int>_>::vector(&this->level_to_max_layer_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->pfm_vec_vec_);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector(&this->node_to_direct_sub_nodes_vec_);
  std::vector<float,_std::allocator<float>_>::vector(&this->item_to_tiv_);
  std::vector<int,_std::allocator<int>_>::vector(&this->item_to_cov_id_);
  std::
  vector<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
  ::vector(&this->node_to_coverage_ids_);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&this->accumulated_tivs_);
  this->noop_profile_id = 0;
  this->stepped_ = stepped;
  init(this,(EVP_PKEY_CTX *)(ulong)(uint)maxRunLevel);
  return;
}

Assistant:

fmcalc(int maxRunLevel, int allocrule,const std::string &inputpath, bool netvalue, bool debug, bool allocruleOptimizationOff,bool generalOptimization, bool stepped):
		inputpath_(inputpath) , netvalue_(netvalue),allocrule_(allocrule), debug_(debug), allocruleOptimizationOff_(allocruleOptimizationOff), generalOptimization_(generalOptimization),
		stepped_(stepped)
		{ init(maxRunLevel); }